

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

void * __thiscall camp::Class::applyOffset(Class *this,void *pointer,Class *target)

{
  int iVar1;
  long lVar2;
  ClassUnrelated *__return_storage_ptr__;
  void *pvVar3;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  ClassUnrelated local_68;
  
  if (pointer == (void *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    iVar1 = baseOffset(this,target);
    if (iVar1 == -1) {
      iVar1 = baseOffset(target,this);
      if (iVar1 == -1) {
        __return_storage_ptr__ = (ClassUnrelated *)__cxa_allocate_exception(0x48);
        ClassUnrelated::ClassUnrelated(&local_68,&this->m_name,&target->m_name);
        std::__cxx11::string::string
                  ((string *)&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
                   ,&local_a9);
        std::__cxx11::string::string
                  ((string *)&local_a8,"void *camp::Class::applyOffset(void *, const Class &) const"
                   ,&local_aa);
        Error::prepare<camp::ClassUnrelated>
                  (__return_storage_ptr__,&local_68,&local_88,0xc2,&local_a8);
        __cxa_throw(__return_storage_ptr__,&ClassUnrelated::typeinfo,Error::~Error);
      }
      lVar2 = -(long)iVar1;
    }
    else {
      lVar2 = (long)iVar1;
    }
    pvVar3 = (void *)((long)pointer + lVar2);
  }
  return pvVar3;
}

Assistant:

void* Class::applyOffset(void* pointer, const Class& target) const
{
    // Special case for null pointers: don't apply offset to leave them null
    if (!pointer)
        return pointer;

    // Check target as a base class of this
    int offset = baseOffset(target);
    if (offset != -1)
        return static_cast<void*>(static_cast<char*>(pointer) + offset);

    // Check target as a derived class of this
    offset = target.baseOffset(*this);
    if (offset != -1)
        return static_cast<void*>(static_cast<char*>(pointer) - offset);

    // No match found, target is not a base class nor a derived class of this
    CAMP_ERROR(ClassUnrelated(name(), target.name()));
}